

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O0

int mk_fifo_queue_id_destroy(mk_fifo *ctx,int id)

{
  mk_fifo_queue *q_00;
  mk_fifo_queue *q;
  int id_local;
  mk_fifo *ctx_local;
  
  q_00 = mk_fifo_queue_get(ctx,id);
  if (q_00 == (mk_fifo_queue *)0x0) {
    ctx_local._4_4_ = -1;
  }
  else {
    mk_fifo_queue_destroy(ctx,q_00);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mk_fifo_queue_id_destroy(struct mk_fifo *ctx, int id)
{
    struct mk_fifo_queue *q;

    q = mk_fifo_queue_get(ctx, id);
    if (!q) {
        return -1;
    }

    mk_fifo_queue_destroy(ctx, q);
    return 0;
}